

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

uint32_t window32(void *blob,int len,int start,int count)

{
  sbyte sVar1;
  uint uVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  uint uVar4;
  uint in_ESI;
  long in_RDI;
  uint32_t t;
  uint32_t b;
  uint32_t a;
  int ib;
  int ia;
  int d;
  int c;
  uint32_t *k;
  int ndwords;
  int nbits;
  undefined4 local_4;
  
  uVar4 = in_EDX % (int)(in_ESI << 3);
  assert((in_ESI & 3) == 0);
  if (in_ECX == 0) {
    local_4 = 0;
  }
  else {
    uVar2 = uVar4 & 0x1f;
    iVar3 = (int)uVar4 / 0x20;
    if (uVar2 == 0) {
      local_4 = *(uint *)(in_RDI + (long)iVar3 * 4) & (1 << ((byte)in_ECX & 0x1f)) - 1U;
    }
    else {
      sVar1 = (sbyte)uVar2;
      local_4 = (1 << ((byte)in_ECX & 0x1f)) - 1U &
                (*(int *)(in_RDI + (long)((iVar3 + 1) % ((int)in_ESI / 4)) * 4) <<
                 (0x20U - sVar1 & 0x1f) |
                *(uint *)(in_RDI + (long)(iVar3 % ((int)in_ESI / 4)) * 4) >> sVar1);
    }
  }
  return local_4;
}

Assistant:

uint32_t window32 ( void * blob, int len, int start, int count )
{
  int nbits = len*8;
  start %= nbits;

  assert((len & 3) == 0);

  int ndwords = len / 4;

  uint32_t * k = (uint32_t*)blob;

  if(count == 0) return 0;

  int c = start & (32-1);
  int d = start / 32;

  if(c == 0) return (k[d] & ((1 << count) - 1));

  int ia = (d + 1) % ndwords;
  int ib = (d + 0) % ndwords;

  uint32_t a = k[ia];
  uint32_t b = k[ib];

  uint32_t t = (a << (32-c)) | (b >> c);

  t &= ((1 << count)-1);

  return t;
}